

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int str_byte(lua_State *L)

{
  StkId pTVar1;
  ulong in_RAX;
  char *pcVar2;
  lua_Integer lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint space;
  size_t l;
  ulong local_38;
  
  local_38 = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&local_38);
  lVar3 = luaL_optinteger(L,2,1);
  uVar7 = (lVar3 >> 0x3f & local_38 + 1) + lVar3;
  space = 0;
  uVar4 = 0;
  if (0 < (long)uVar7) {
    uVar4 = uVar7;
  }
  lVar3 = luaL_optinteger(L,3,uVar4);
  uVar4 = (lVar3 >> 0x3f & local_38 + 1) + lVar3;
  if ((long)uVar4 < 1) {
    uVar4 = 0;
  }
  if ((long)uVar7 < 2) {
    uVar7 = 1;
  }
  if (local_38 <= uVar4) {
    uVar4 = local_38;
  }
  if (uVar7 <= uVar4) {
    uVar6 = (int)uVar4 - (int)uVar7;
    space = uVar6 + 1;
    if ((long)((long)(int)space + uVar7) <= (long)uVar4) {
      luaL_error(L,"string slice too long");
    }
    luaL_checkstack(L,space,"string slice too long");
    if (uVar6 < 0x7fffffff) {
      uVar4 = 1;
      if (1 < (int)space) {
        uVar4 = (ulong)space;
      }
      uVar5 = 0;
      do {
        pTVar1 = L->top;
        (pTVar1->value).n = (double)(byte)pcVar2[uVar5 + (uVar7 - 1)];
        pTVar1->tt = 3;
        L->top = L->top + 1;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return space;
}

Assistant:

static int str_byte(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
ptrdiff_t posi=posrelat(luaL_optinteger(L,2,1),l);
ptrdiff_t pose=posrelat(luaL_optinteger(L,3,posi),l);
int n,i;
if(posi<=0)posi=1;
if((size_t)pose>l)pose=l;
if(posi>pose)return 0;
n=(int)(pose-posi+1);
if(posi+n<=pose)
luaL_error(L,"string slice too long");
luaL_checkstack(L,n,"string slice too long");
for(i=0;i<n;i++)
lua_pushinteger(L,uchar(s[posi+i-1]));
return n;
}